

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O1

bool __thiscall miniros::observer::impl::Connections::isEmpty(Connections *this)

{
  Connection *pCVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 == 0) {
    pCVar1 = (this->m_root).m_next;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return pCVar1 == &this->m_root;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool isEmpty() const {
        std::scoped_lock<mutex_t> lock(m_mutex);
        return m_root.m_next == &m_root;
    }